

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_fft.c
# Opt level: O2

t_int * sigrfft_flip(t_int *w)

{
  long lVar1;
  t_int tVar2;
  uint *puVar3;
  long lVar4;
  
  lVar1 = w[1];
  puVar3 = (uint *)w[2];
  tVar2 = w[3];
  for (lVar4 = 0; puVar3 = puVar3 + -1, (int)tVar2 != (int)lVar4; lVar4 = lVar4 + 1) {
    *puVar3 = *(uint *)(lVar1 + lVar4 * 4) ^ 0x80000000;
  }
  return w + 4;
}

Assistant:

static t_int *sigrfft_flip(t_int *w)
{
    t_sample *in = (t_sample *)(w[1]);
    t_sample *out = (t_sample *)(w[2]);
    int n = (int)w[3];
    while (n--)
        *(--out) = - *in++;
    return (w+4);
}